

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_i_refvec.h
# Opt level: O2

void __thiscall TNT::i_refvec<int>::~i_refvec(i_refvec<int> *this)

{
  int *piVar1;
  
  piVar1 = this->ref_count_;
  if ((piVar1 != (int *)0x0) && (*piVar1 = *piVar1 + -1, *piVar1 == 0)) {
    if (this->ref_count_ != (int *)0x0) {
      operator_delete(this->ref_count_,4);
      if (this->data_ != (int *)0x0) {
        operator_delete__(this->data_);
      }
      this->data_ = (int *)0x0;
    }
    return;
  }
  return;
}

Assistant:

i_refvec<T>::~i_refvec()
{
	if (ref_count_ != NULL)
	{
		(*ref_count_)--;

		if (*ref_count_ == 0)
		destroy();
	}
}